

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void __thiscall wallet::SQLiteCursor::~SQLiteCursor(SQLiteCursor *this)

{
  int iVar1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DatabaseCursor)._vptr_DatabaseCursor = (_func_int **)&PTR__SQLiteCursor_0063a728;
  sqlite3_clear_bindings(this->m_cursor_stmt);
  sqlite3_reset(this->m_cursor_stmt);
  iVar1 = sqlite3_finalize(this->m_cursor_stmt);
  if (iVar1 != 0) {
    local_18 = (char *)sqlite3_errstr(iVar1);
    logging_function._M_str = "~SQLiteCursor";
    logging_function._M_len = 0xd;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x61;
    LogPrintFormatInternal<char[14],char_const*>
              (logging_function,source_file,0x24e,ALL,Info,(ConstevalFormatString<2U>)0x3f2bd4,
               (char (*) [14])"~SQLiteCursor",&local_18);
  }
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&(this->m_prefix_range_end).super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&(this->m_prefix_range_start).super__Vector_base<std::byte,_std::allocator<std::byte>_>
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLiteCursor::~SQLiteCursor()
{
    sqlite3_clear_bindings(m_cursor_stmt);
    sqlite3_reset(m_cursor_stmt);
    int res = sqlite3_finalize(m_cursor_stmt);
    if (res != SQLITE_OK) {
        LogPrintf("%s: cursor closed but could not finalize cursor statement: %s\n",
                  __func__, sqlite3_errstr(res));
    }
}